

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# genmbcs.cpp
# Opt level: O2

UBool MBCSAddFromUnicode(MBCSData *mbcsData,uint8_t *bytes,int32_t length,UChar32 c,int8_t flag)

{
  char cVar1;
  byte bVar2;
  byte bVar3;
  uint8_t *puVar4;
  long lVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  sbyte sVar9;
  byte bVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  char *__format;
  ushort uVar14;
  uint uVar15;
  uint32_t uVar16;
  uint uVar17;
  FILE *pFVar18;
  byte *pbVar19;
  byte *pbVar20;
  ulong uVar21;
  ulong uVar22;
  uint16_t *puVar23;
  bool bVar24;
  char buffer [10];
  
  pFVar18 = _stderr;
  uVar8 = (mbcsData->ucm->states).maxCharLength;
  if ((((mbcsData->ucm->states).outputType == '\f') && (IGNORE_SISO_CHECK == '\0')) &&
     ((*bytes & 0xfe) == 0xe)) {
    printBytes(buffer,bytes,length);
    __format = "error: illegal mapping to SI or SO for SI/SO codepage: U+%04x<->0x%s\n";
    goto LAB_001e7783;
  }
  if ((length == 1 && flag == '\x01') && (*bytes == '\0')) {
    fprintf(_stderr,"error: unable to encode a |1 fallback from U+%04x to 0x%02x\n",(ulong)(uint)c,0
           );
    return '\0';
  }
  puVar4 = mbcsData->fromUBytes;
  uVar11 = c >> 10;
  cVar1 = mbcsData->utf8Friendly;
  if ((cVar1 == '\0') || (uVar14 = mbcsData->utf8Max, (int)(uint)uVar14 < c)) {
    uVar6 = (uint)c >> 4 & 0x3f;
    uVar14 = mbcsData->stage1[uVar11];
    if (uVar14 == 0) {
      puVar23 = mbcsData->stage1 + uVar11;
      uVar13 = mbcsData->stage2Top;
      if (cVar1 != '\0') goto LAB_001e73ad;
      goto LAB_001e73d7;
    }
LAB_001e740c:
    uVar6 = uVar14 + uVar6;
    if (cVar1 != '\0') {
      uVar14 = mbcsData->utf8Max;
      goto LAB_001e7425;
    }
    sVar9 = 4;
    uVar11 = 0xf;
  }
  else {
    uVar6 = (uint)c >> 4 & 0x3c;
    if (mbcsData->stage1[uVar11] == 0) {
      puVar23 = mbcsData->stage1 + uVar11;
      uVar13 = mbcsData->stage2Top;
LAB_001e73ad:
      uVar17 = uVar13 - uVar6;
      uVar21 = (ulong)uVar13;
      uVar15 = uVar17;
      if (uVar13 < uVar17) {
        uVar15 = uVar13;
      }
      uVar12 = uVar13 + 1;
      do {
        uVar13 = uVar15;
        if (uVar21 <= uVar17) break;
        uVar13 = uVar12 - 1;
        lVar5 = uVar21 - 1;
        uVar21 = uVar21 - 1;
        uVar12 = uVar13;
      } while (mbcsData->stage2[lVar5] == 0);
LAB_001e73d7:
      uVar15 = uVar13 + 0x40;
      if (0xfbc0 < uVar15) {
        printBytes(buffer,bytes,length);
        __format = "error: too many stage 2 entries at U+%04x<->0x%s\n";
        goto LAB_001e7783;
      }
      for (; uVar13 < uVar15; uVar13 = uVar13 + 0x40) {
        uVar21 = (ulong)uVar11;
        uVar11 = uVar11 + 1;
        mbcsData->stage1[uVar21] = (uint16_t)uVar13;
      }
      mbcsData->stage2Top = uVar15;
      uVar14 = *puVar23;
      goto LAB_001e740c;
    }
    uVar6 = uVar6 + mbcsData->stage1[uVar11];
LAB_001e7425:
    sVar9 = (c <= (int)(uint)uVar14) * '\x02' + 4;
    uVar11 = 0x3f;
    if ((int)(uint)uVar14 < c) {
      uVar11 = 0xf;
    }
  }
  pFVar18 = _stderr;
  uVar11 = uVar11 & c;
  uVar16 = mbcsData->stage2[uVar6];
  if (uVar16 == 0) {
    uVar13 = mbcsData->stage3Top;
    uVar21 = (ulong)uVar13;
    if ((cVar1 != '\0') && (0xf < uVar11)) {
      uVar12 = (uVar11 & 0xfffffff0) * uVar8;
      uVar21 = (ulong)uVar12;
      uVar15 = uVar13;
      uVar17 = 0xffffffff;
      do {
        uVar15 = uVar15 - 1;
        bVar24 = uVar21 == 0;
        uVar21 = uVar21 - 1;
        uVar7 = uVar12;
        if (bVar24) break;
        uVar7 = uVar17 + 1;
        uVar17 = uVar7;
      } while (puVar4[uVar15] == '\0');
      uVar21 = (ulong)(uVar13 + ((uVar7 >> 4) / uVar8) * uVar8 * -0x10);
    }
    uVar13 = (uVar8 << sVar9) + (int)uVar21;
    if (uVar8 * 0x100000 < uVar13) {
      printBytes(buffer,bytes,length);
      __format = "error: too many code points at U+%04x<->0x%s\n";
LAB_001e7783:
      fprintf(pFVar18,__format,(ulong)(uint)c,buffer);
      return '\0';
    }
    uVar15 = uVar6;
    while( true ) {
      uVar22 = (ulong)uVar15;
      if (uVar13 <= (uint)uVar21) break;
      uVar15 = uVar15 + 1;
      mbcsData->stage2[uVar22] = (uint32_t)((uVar21 >> 4) / (ulong)uVar8);
      uVar21 = (ulong)((uint)uVar21 + uVar8 * 0x10);
    }
    mbcsData->stage3Top = uVar13;
    uVar16 = mbcsData->stage2[uVar6];
  }
  uVar13 = uVar16 << 4 & 0xffff0;
  if ((cVar1 != '\0') && (c <= (int)(uint)mbcsData->utf8Max)) {
    if (uVar13 < 0x10000) {
      mbcsData->stageUTF8[c >> 6] = (uint16_t)(uVar16 << 4);
    }
    else {
      mbcsData->utf8Max = 0xfeff;
    }
  }
  uVar17 = 0;
  uVar15 = 0;
  pbVar19 = bytes;
  if (length != 2) {
    pbVar20 = bytes;
    if (length != 3) {
      if (length != 4) goto LAB_001e758f;
      pbVar20 = bytes + 1;
      uVar15 = (uint)*bytes << 8;
    }
    pbVar19 = pbVar20 + 1;
    uVar17 = (*pbVar20 | uVar15) << 8;
  }
  pbVar20 = pbVar19 + 1;
  uVar17 = (*pbVar19 | uVar17) << 8;
LAB_001e758f:
  bVar10 = *pbVar20;
  uVar15 = uVar17 | bVar10;
  uVar21 = (ulong)((uVar13 + uVar11) * uVar8);
  if (uVar8 == 4) {
    uVar13 = *(uint *)(puVar4 + uVar21);
    *(uint *)(puVar4 + uVar21) = uVar15;
  }
  else if (uVar8 == 3) {
    bVar2 = puVar4[uVar21];
    puVar4[uVar21] = (uint8_t)(uVar17 >> 0x10);
    bVar3 = puVar4[uVar21 + 1];
    puVar4[uVar21 + 1] = (uint8_t)(uVar17 >> 8);
    uVar13 = (uint)puVar4[uVar21 + 2] | (uint)bVar3 << 8 | (uint)bVar2 << 0x10;
    puVar4[uVar21 + 2] = bVar10;
  }
  else {
    uVar13 = 0;
    if (uVar8 == 2) {
      uVar13 = (uint)*(ushort *)(puVar4 + uVar21);
      *(short *)(puVar4 + uVar21) = (short)uVar15;
    }
  }
  pFVar18 = _stderr;
  bVar10 = (byte)c & 0xf | 0x10;
  uVar6 = (uVar11 >> 4) + uVar6;
  uVar8 = mbcsData->stage2[uVar6];
  if (((uVar8 >> bVar10 & 1) == 0) && (uVar13 == 0)) {
    if ('\0' < flag) {
      return '\x01';
    }
  }
  else {
    if (-1 < flag) {
      printBytes(buffer,bytes,length);
      fprintf(pFVar18,"error: duplicate Unicode code point at U+%04x<->0x%s see 0x%02x\n",
              (ulong)(uint)c,buffer,(ulong)uVar13);
      return '\0';
    }
    if (VERBOSE != '\0') {
      printBytes(buffer,bytes,length);
      fprintf(pFVar18,"duplicate Unicode code point at U+%04x<->0x%s see 0x%02x\n",(ulong)(uint)c,
              buffer,(ulong)uVar13);
      uVar8 = mbcsData->stage2[uVar6];
    }
  }
  mbcsData->stage2[uVar6] = (uint)(1L << bVar10) | uVar8;
  return '\x01';
}

Assistant:

static UBool
MBCSAddFromUnicode(MBCSData *mbcsData,
                   const uint8_t *bytes, int32_t length,
                   UChar32 c,
                   int8_t flag) {
    char buffer[10];
    const uint8_t *pb;
    uint8_t *stage3, *p;
    uint32_t idx, b, old, stage3Index;
    int32_t maxCharLength;

    uint32_t blockSize, newTop, i, nextOffset, newBlock, min, overlap, maxOverlap;

    maxCharLength=mbcsData->ucm->states.maxCharLength;

    if( mbcsData->ucm->states.outputType==MBCS_OUTPUT_2_SISO &&
        (!IGNORE_SISO_CHECK && (*bytes==0xe || *bytes==0xf))
    ) {
        fprintf(stderr, "error: illegal mapping to SI or SO for SI/SO codepage: U+%04x<->0x%s\n",
            (int)c, printBytes(buffer, bytes, length));
        return FALSE;
    }

    if(flag==1 && length==1 && *bytes==0) {
        fprintf(stderr, "error: unable to encode a |1 fallback from U+%04x to 0x%02x\n",
            (int)c, *bytes);
        return FALSE;
    }

    /*
     * Walk down the triple-stage compact array ("trie") and
     * allocate parts as necessary.
     * Note that the first stage 2 and 3 blocks are reserved for
     * all-unassigned mappings.
     * We assume that length<=maxCharLength and that c<=0x10ffff.
     */
    stage3=mbcsData->fromUBytes;

    /* inspect stage 1 */
    idx=c>>MBCS_STAGE_1_SHIFT;
    if(mbcsData->utf8Friendly && c<=mbcsData->utf8Max) {
        nextOffset=(c>>MBCS_STAGE_2_SHIFT)&MBCS_STAGE_2_BLOCK_MASK&~(MBCS_UTF8_STAGE_3_BLOCKS-1);
    } else {
        nextOffset=(c>>MBCS_STAGE_2_SHIFT)&MBCS_STAGE_2_BLOCK_MASK;
    }
    if(mbcsData->stage1[idx]==MBCS_STAGE_2_ALL_UNASSIGNED_INDEX) {
        /* allocate another block in stage 2 */
        newBlock=mbcsData->stage2Top;
        if(mbcsData->utf8Friendly) {
            min=newBlock-nextOffset; /* minimum block start with overlap */
            while(min<newBlock && mbcsData->stage2[newBlock-1]==0) {
                --newBlock;
            }
        }
        newTop=newBlock+MBCS_STAGE_2_BLOCK_SIZE;

        if(newTop>MBCS_MAX_STAGE_2_TOP) {
            fprintf(stderr, "error: too many stage 2 entries at U+%04x<->0x%s\n",
                (int)c, printBytes(buffer, bytes, length));
            return FALSE;
        }

        /*
         * each stage 2 block contains 64 32-bit words:
         * 6 code point bits 9..4 with value with bits 31..16 "assigned" flags and bits 15..0 stage 3 index
         */
        i=idx;
        while(newBlock<newTop) {
            mbcsData->stage1[i++]=(uint16_t)newBlock;
            newBlock+=MBCS_STAGE_2_BLOCK_SIZE;
        }
        mbcsData->stage2Top=newTop; /* ==newBlock */
    }

    /* inspect stage 2 */
    idx=mbcsData->stage1[idx]+nextOffset;
    if(mbcsData->utf8Friendly && c<=mbcsData->utf8Max) {
        /* allocate 64-entry blocks for UTF-8-friendly lookup */
        blockSize=MBCS_UTF8_STAGE_3_BLOCK_SIZE*maxCharLength;
        nextOffset=c&MBCS_UTF8_STAGE_3_BLOCK_MASK;
    } else {
        blockSize=MBCS_STAGE_3_BLOCK_SIZE*maxCharLength;
        nextOffset=c&MBCS_STAGE_3_BLOCK_MASK;
    }
    if(mbcsData->stage2[idx]==0) {
        /* allocate another block in stage 3 */
        newBlock=mbcsData->stage3Top;
        if(mbcsData->utf8Friendly && nextOffset>=MBCS_STAGE_3_GRANULARITY) {
            /*
             * Overlap stage 3 blocks only in multiples of 16-entry blocks
             * because of the indexing granularity in stage 2.
             */
            maxOverlap=(nextOffset&~(MBCS_STAGE_3_GRANULARITY-1))*maxCharLength;
            for(overlap=0;
                overlap<maxOverlap && stage3[newBlock-overlap-1]==0;
                ++overlap) {}

            overlap=(overlap/MBCS_STAGE_3_GRANULARITY)/maxCharLength;
            overlap=(overlap*MBCS_STAGE_3_GRANULARITY)*maxCharLength;

            newBlock-=overlap;
        }
        newTop=newBlock+blockSize;

        if(newTop>MBCS_STAGE_3_MBCS_SIZE*(uint32_t)maxCharLength) {
            fprintf(stderr, "error: too many code points at U+%04x<->0x%s\n",
                (int)c, printBytes(buffer, bytes, length));
            return FALSE;
        }
        /* each block has 16*maxCharLength bytes */
        i=idx;
        while(newBlock<newTop) {
            mbcsData->stage2[i++]=(newBlock/MBCS_STAGE_3_GRANULARITY)/maxCharLength;
            newBlock+=MBCS_STAGE_3_BLOCK_SIZE*maxCharLength;
        }
        mbcsData->stage3Top=newTop; /* ==newBlock */
    }

    stage3Index=MBCS_STAGE_3_GRANULARITY*(uint32_t)(uint16_t)mbcsData->stage2[idx];

    /* Build an alternate, UTF-8-friendly stage table as well. */
    if(mbcsData->utf8Friendly && c<=mbcsData->utf8Max) {
        /* Overflow for uint16_t entries in stageUTF8? */
        if(stage3Index>0xffff) {
            /*
             * This can occur only if the mapping table is nearly perfectly filled and if
             * utf8Max==0xffff.
             * (There is no known charset like this. GB 18030 does not map
             * surrogate code points and LMBCS does not map 256 PUA code points.)
             *
             * Otherwise, stage3Index<=MBCS_UTF8_LIMIT<0xffff
             * (stage3Index can at most reach exactly MBCS_UTF8_LIMIT)
             * because we have a sorted table and there are at most MBCS_UTF8_LIMIT
             * mappings with 0<=c<MBCS_UTF8_LIMIT, and there is only also
             * the initial all-unassigned block in stage3.
             *
             * Solution for the overflow: Reduce utf8Max to the next lower value, 0xfeff.
             *
             * (See svn revision 20866 of the markus/ucnvutf8 feature branch for
             * code that causes MBCSAddTable() to rebuild the table not utf8Friendly
             * in case of overflow. That code was not tested.)
             */
            mbcsData->utf8Max=0xfeff;
        } else {
            /*
             * The stage 3 block has been assigned for the regular trie.
             * Just copy its index into stageUTF8[], without the granularity.
             */
            mbcsData->stageUTF8[c>>MBCS_UTF8_STAGE_SHIFT]=(uint16_t)stage3Index;
        }
    }

    /* write the codepage bytes into stage 3 and get the previous bytes */

    /* assemble the bytes into a single integer */
    pb=bytes;
    b=0;
    switch(length) {
    case 4:
        b=*pb++;
        U_FALLTHROUGH;
    case 3:
        b=(b<<8)|*pb++;
        U_FALLTHROUGH;
    case 2:
        b=(b<<8)|*pb++;
        U_FALLTHROUGH;
    case 1:
    default:
        b=(b<<8)|*pb++;
        break;
    }

    old=0;
    p=stage3+(stage3Index+nextOffset)*maxCharLength;
    switch(maxCharLength) {
    case 2:
        old=*(uint16_t *)p;
        *(uint16_t *)p=(uint16_t)b;
        break;
    case 3:
        old=(uint32_t)*p<<16;
        *p++=(uint8_t)(b>>16);
        old|=(uint32_t)*p<<8;
        *p++=(uint8_t)(b>>8);
        old|=*p;
        *p=(uint8_t)b;
        break;
    case 4:
        old=*(uint32_t *)p;
        *(uint32_t *)p=b;
        break;
    default:
        /* will never occur */
        break;
    }

    /* check that this Unicode code point was still unassigned */
    if((mbcsData->stage2[idx+(nextOffset>>MBCS_STAGE_2_SHIFT)]&(1UL<<(16+(c&0xf))))!=0 || old!=0) {
        if(flag>=0) {
            fprintf(stderr, "error: duplicate Unicode code point at U+%04x<->0x%s see 0x%02x\n",
                (int)c, printBytes(buffer, bytes, length), (int)old);
            return FALSE;
        } else if(VERBOSE) {
            fprintf(stderr, "duplicate Unicode code point at U+%04x<->0x%s see 0x%02x\n",
                (int)c, printBytes(buffer, bytes, length), (int)old);
        }
        /* continue after the above warning if the precision of the mapping is
           unspecified */
    }
    if(flag<=0) {
        /* set the roundtrip flag */
        mbcsData->stage2[idx+(nextOffset>>4)]|=(1UL<<(16+(c&0xf)));
    }

    return TRUE;
}